

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AST.cc
# Opt level: O0

SourceLocation * __thiscall
flow::lang::ParamList::location(SourceLocation *__return_storage_ptr__,ParamList *this)

{
  FilePos _beg;
  bool bVar1;
  ASTNode *pAVar2;
  SourceLocation *_fileName;
  SourceLocation *pSVar3;
  ParamList *this_local;
  
  bVar1 = std::
          vector<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>,_std::allocator<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>_>_>
          ::empty(&this->values_);
  if (bVar1) {
    SourceLocation::SourceLocation(__return_storage_ptr__);
  }
  else {
    pAVar2 = &front(this)->super_ASTNode;
    _fileName = ASTNode::location(pAVar2);
    pAVar2 = &front(this)->super_ASTNode;
    pSVar3 = ASTNode::location(pAVar2);
    _beg = pSVar3->begin;
    pAVar2 = &back(this)->super_ASTNode;
    pSVar3 = ASTNode::location(pAVar2);
    SourceLocation::SourceLocation(__return_storage_ptr__,&_fileName->filename,_beg,pSVar3->end);
  }
  return __return_storage_ptr__;
}

Assistant:

SourceLocation ParamList::location() const {
  if (values_.empty()) return SourceLocation();

  return SourceLocation(front()->location().filename, front()->location().begin,
                      back()->location().end);
}